

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int NV12Copy(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,uint8_t *dst_y,
            int dst_stride_y,uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  int iVar1;
  int iVar2;
  uint height_00;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar3._4_4_ = -(uint)(dst_y == (uint8_t *)0x0);
  auVar3._8_4_ = -(uint)(src_uv == (uint8_t *)0x0);
  auVar3._12_4_ = -(uint)(dst_uv == (uint8_t *)0x0);
  iVar2 = movmskps((int)src_uv,auVar3);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar2 == 0) {
    if (height < 0) {
      iVar1 = -height;
      height_00 = 1U - height >> 1;
      src_y = src_y + ~height * src_stride_y;
      src_uv = src_uv + (int)((height_00 - 1) * src_stride_uv);
      src_stride_y = -src_stride_y;
      src_stride_uv = -src_stride_uv;
    }
    else {
      height_00 = height + 1 >> 1;
      iVar1 = height;
    }
    CopyPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,iVar1);
    CopyPlane(src_uv,src_stride_uv,dst_uv,dst_stride_uv,width + 1U & 0x7ffffffe,height_00);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int NV12Copy(const uint8_t* src_y, int src_stride_y, const uint8_t* src_uv,
             int src_stride_uv, uint8_t* dst_y, int dst_stride_y,
             uint8_t* dst_uv, int dst_stride_uv, int width, int height) {
  if (!src_y || !dst_y || !src_uv || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }

  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_y = src_y + (height - 1) * src_stride_y;
    src_uv = src_uv + (halfheight - 1) * src_stride_uv;
    src_stride_y = -src_stride_y;
    src_stride_uv = -src_stride_uv;
  }
  CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  CopyPlane(src_uv, src_stride_uv, dst_uv, dst_stride_uv, halfwidth * 2,
            halfheight);
  return 0;
}